

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

xmlCatalogPtr xmlLoadACatalog(char *filename)

{
  byte bVar1;
  xmlCatalogPrefer xVar2;
  int iVar3;
  byte *value;
  byte *pbVar4;
  xmlCatalogPtr catal;
  xmlCatalogEntryPtr pxVar5;
  
  value = xmlLoadFileContent(filename);
  xVar2 = xmlCatalogDefaultPrefer;
  pbVar4 = value;
  if (value == (byte *)0x0) {
    return (xmlCatalogPtr)0x0;
  }
  do {
    bVar1 = *pbVar4;
    if ((bVar1 == 0) || (bVar1 == 0x2d)) break;
    if (bVar1 == 0x3c) {
      catal = (xmlCatalogPtr)(*xmlMalloc)(0x78);
      if (catal != (xmlCatalogPtr)0x0) {
        *(undefined8 *)catal = 0;
        catal->catalTab[0] = (char *)0x0;
        catal->catalTab[9] = (char *)0x0;
        catal->catalNr = 0;
        catal->catalMax = 0;
        catal->sgml = (xmlHashTablePtr)0x0;
        *(undefined8 *)&catal->prefer = 0;
        catal->catalTab[7] = (char *)0x0;
        catal->catalTab[8] = (char *)0x0;
        catal->catalTab[5] = (char *)0x0;
        catal->catalTab[6] = (char *)0x0;
        catal->catalTab[3] = (char *)0x0;
        catal->catalTab[4] = (char *)0x0;
        catal->catalTab[1] = (char *)0x0;
        catal->catalTab[2] = (char *)0x0;
        catal->xml = (xmlCatalogEntryPtr)0x0;
        catal->type = XML_XML_CATALOG_TYPE;
        catal->catalMax = 10;
        catal->prefer = xVar2;
        pxVar5 = xmlNewCatalogEntry(XML_CATA_CATALOG,(xmlChar *)0x0,(xmlChar *)0x0,
                                    (xmlChar *)filename,xmlCatalogDefaultPrefer,
                                    (xmlCatalogEntryPtr)0x0);
        catal->xml = pxVar5;
        goto LAB_0013a5d1;
      }
      xmlCatalogErrMemory("allocating catalog");
      goto LAB_0013a5ce;
    }
    pbVar4 = pbVar4 + 1;
  } while ((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6);
  catal = xmlCreateNewCatalog(XML_SGML_CATALOG_TYPE,xmlCatalogDefaultPrefer);
  if (catal != (xmlCatalogPtr)0x0) {
    iVar3 = xmlParseSGMLCatalog(catal,value,filename,0);
    if (-1 < iVar3) goto LAB_0013a5d1;
    xmlFreeCatalog(catal);
  }
LAB_0013a5ce:
  catal = (xmlCatalogPtr)0x0;
LAB_0013a5d1:
  (*xmlFree)(value);
  return catal;
}

Assistant:

xmlCatalogPtr
xmlLoadACatalog(const char *filename)
{
    xmlChar *content;
    xmlChar *first;
    xmlCatalogPtr catal;
    int ret;

    content = xmlLoadFileContent(filename);
    if (content == NULL)
        return(NULL);


    first = content;

    while ((*first != 0) && (*first != '-') && (*first != '<') &&
	   (!(((*first >= 'A') && (*first <= 'Z')) ||
	      ((*first >= 'a') && (*first <= 'z')))))
	first++;

    if (*first != '<') {
	catal = xmlCreateNewCatalog(XML_SGML_CATALOG_TYPE, xmlCatalogDefaultPrefer);
	if (catal == NULL) {
	    xmlFree(content);
	    return(NULL);
	}
        ret = xmlParseSGMLCatalog(catal, content, filename, 0);
	if (ret < 0) {
	    xmlFreeCatalog(catal);
	    xmlFree(content);
	    return(NULL);
	}
    } else {
	catal = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE, xmlCatalogDefaultPrefer);
	if (catal == NULL) {
	    xmlFree(content);
	    return(NULL);
	}
        catal->xml = xmlNewCatalogEntry(XML_CATA_CATALOG, NULL,
		       NULL, BAD_CAST filename, xmlCatalogDefaultPrefer, NULL);
    }
    xmlFree(content);
    return (catal);
}